

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::RoaringScanState::ScanPartial
          (RoaringScanState *this,idx_t start_idx,Vector *result,idx_t offset,idx_t count)

{
  RoaringScanState *this_00;
  ContainerScanState *scan_state_00;
  unsigned_long to_scan_00;
  long in_RSI;
  RoaringScanState *in_RDI;
  unsigned_long in_R8;
  idx_t to_scan;
  idx_t remaining_in_container;
  ContainerScanState *scan_state;
  idx_t container_idx;
  idx_t internal_offset;
  idx_t scanned;
  idx_t remaining;
  idx_t in_stack_00000080;
  idx_t in_stack_00000088;
  RoaringScanState *in_stack_00000090;
  idx_t in_stack_00000348;
  Vector *in_stack_00000350;
  idx_t local_40;
  long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  long local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  Vector::Flatten(in_stack_00000350,in_stack_00000348);
  local_38 = 0;
  for (local_30 = local_28; local_30 != 0; local_30 = local_30 - to_scan_00) {
    GetContainerIndex(in_RDI,local_10 + local_38,&local_40);
    this_00 = (RoaringScanState *)
              LoadContainer(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    scan_state_00 =
         (ContainerScanState *)
         ((long)(this_00->handle).handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi - (long)(this_00->handle).node.ptr);
    to_scan_00 = MinValue<unsigned_long>(local_30,(unsigned_long)scan_state_00);
    ScanInternal(this_00,scan_state_00,to_scan_00,(Vector *)in_RDI,0xa04766);
    local_38 = to_scan_00 + local_38;
  }
  return;
}

Assistant:

void RoaringScanState::ScanPartial(idx_t start_idx, Vector &result, idx_t offset, idx_t count) {
	result.Flatten(count);
	idx_t remaining = count;
	idx_t scanned = 0;
	while (remaining) {
		idx_t internal_offset;
		idx_t container_idx = GetContainerIndex(start_idx + scanned, internal_offset);
		auto &scan_state = LoadContainer(container_idx, internal_offset);
		idx_t remaining_in_container = scan_state.container_size - scan_state.scanned_count;
		idx_t to_scan = MinValue<idx_t>(remaining, remaining_in_container);
		ScanInternal(scan_state, to_scan, result, offset + scanned);
		remaining -= to_scan;
		scanned += to_scan;
	}
	D_ASSERT(scanned == count);
}